

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O2

QLayoutItem * __thiscall QToolBarLayout::takeAt(QToolBarLayout *this,int index)

{
  int iVar1;
  QToolBarItem *pQVar2;
  QWidgetAction *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if ((index < 0) || ((ulong)(this->items).d.size <= (ulong)(uint)index)) {
    pQVar2 = (QToolBarItem *)0x0;
  }
  else {
    pQVar2 = QList<QToolBarItem_*>::takeAt(&this->items,(ulong)(uint)index);
    if (&this->popupMenu->super_QWidget != (QWidget *)0x0) {
      QWidget::removeAction(&this->popupMenu->super_QWidget,pQVar2->action);
    }
    this_00 = QtPrivate::qobject_cast_helper<QWidgetAction*,QObject>((QObject *)pQVar2->action);
    if ((this_00 == (QWidgetAction *)0x0) || (pQVar2->customWidget != true)) {
      iVar1 = (*(pQVar2->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])(pQVar2);
      QWidget::hide((QWidget *)CONCAT44(extraout_var_00,iVar1));
      (*(pQVar2->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])(pQVar2);
      QObject::deleteLater();
    }
    else {
      iVar1 = (*(pQVar2->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])(pQVar2);
      QWidgetAction::releaseWidget(this_00,(QWidget *)CONCAT44(extraout_var,iVar1));
    }
    (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
  }
  return (QLayoutItem *)pQVar2;
}

Assistant:

QLayoutItem *QToolBarLayout::takeAt(int index)
{
    if (index < 0 || index >= items.size())
        return nullptr;
    QToolBarItem *item = items.takeAt(index);

    if (popupMenu)
        popupMenu->removeAction(item->action);

    QWidgetAction *widgetAction = qobject_cast<QWidgetAction*>(item->action);
    if (widgetAction != nullptr && item->customWidget) {
        widgetAction->releaseWidget(item->widget());
    } else {
        // destroy the QToolButton/QToolBarSeparator
        item->widget()->hide();
        item->widget()->deleteLater();
    }

    invalidate();
    return item;
}